

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall vm::VM::CALL(VM *this,u2 index)

{
  vector<vm::VM::Context,_std::allocator<vm::VM::Context>_> *this_00;
  ushort uVar1;
  pointer pFVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  undefined6 in_register_00000032;
  ulong uVar9;
  undefined1 local_60 [24];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  ushort local_28;
  
  pFVar2 = (this->_file).functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->_file).functions.
                    super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pFVar2 >> 5) <=
      (CONCAT62(in_register_00000032,index) & 0xffffffff)) {
LAB_001189e8:
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = &PTR__exception_00124c38;
    __cxa_throw(puVar6,&InvalidControlTransfer::typeinfo,std::exception::~exception);
  }
  local_60._20_4_ = ZEXT24(index);
  uVar9 = (ulong)(uint)((int)CONCAT62(in_register_00000032,index) << 5);
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  uVar1 = *(ushort *)((long)&pFVar2->nameIndex + uVar9);
  pCVar3 = (this->_file).constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->_file).constants.
                 super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pCVar3 >> 4) * -0x5555555555555555;
  local_48._M_p = (pointer)&local_38;
  if (uVar1 <= uVar8 && uVar8 - uVar1 != 0) {
    std::get<0ul,std::__cxx11::string,int,double>
              ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                *)((long)&(pCVar3->value).
                          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                          .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double> +
                  (ulong)((uint)uVar1 * 0x30)));
    std::__cxx11::string::_M_assign((string *)&local_48);
    local_28 = *(ushort *)((long)&pFVar2->level + uVar9);
    this_00 = &this->_contexts;
    pCVar4 = (this->_contexts).super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar1 = pCVar4[-1].functionLevel;
    uVar7 = (uint)uVar1;
    if (uVar1 + 1 == (uint)local_28) {
      local_60._16_4_ =
           (int)((ulong)((long)pCVar4 -
                        (long)(this_00->
                              super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>)
                              ._M_impl.super__Vector_impl_data._M_start) >> 6) + -1;
    }
    else {
      if (uVar1 < local_28) goto LAB_00118a20;
      local_60._16_4_ = pCVar4[-1].staticLink;
      if (local_28 < uVar1) {
        pCVar5 = (this_00->super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          if ((ulong)((long)pCVar4 - (long)pCVar5 >> 6) <= (ulong)(long)(int)local_60._16_4_) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_001189e8;
          }
          uVar7 = uVar7 - 1;
          local_60._16_4_ = pCVar5[(int)local_60._16_4_].staticLink;
        } while ((int)(uint)local_28 < (int)uVar7);
      }
    }
    local_60._8_4_ = this->_bp;
    local_60._0_4_ = this->_ip;
    ensureStackUsed(this,(uint)*(ushort *)((long)&pFVar2->paramSize + uVar9));
    local_60._4_4_ = this->_sp - (uint)*(ushort *)((long)&pFVar2->paramSize + uVar9);
    this->_bp = local_60._4_4_;
    local_60._12_4_ = local_60._4_4_;
    std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::push_back
              (this_00,(value_type *)local_60);
    this->_ip = -1;
    std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::operator=
              (&this->_currentInstructions,
               (vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)
               ((long)&(pFVar2->instructions).
                       super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
               + uVar9));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,
                      CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]) + 1);
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00118a20:
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = &PTR__exception_00124c38;
  __cxa_throw(puVar6,&InvalidControlTransfer::typeinfo,std::exception::~exception);
}

Assistant:

void VM::CALL(u2 index) {
    if (0 > index || index >= this->_file.functions.size()) {
        throw InvalidControlTransfer();
    }
    Function& calledFunction = this->_file.functions.at(index);
    Context newContext;
    newContext.functionIndex = index;
    newContext.functionName = std::get<str_t>(this->_file.constants.at(calledFunction.nameIndex).value);

    newContext.functionLevel = calledFunction.level;
    int newLv = newContext.functionLevel;
    int curLv = _contexts.back().functionLevel;
    if (newLv == curLv + 1) {
        newContext.staticLink = _contexts.size()-1;
    }
    else if (newLv <= curLv) {
        int staticLink = _contexts.back().staticLink;
        for (; curLv > newLv; --curLv) {
            staticLink = _contexts.at(staticLink).staticLink;
        }
        newContext.staticLink = staticLink;
    }
    else {
        throw InvalidControlTransfer();
    }
    newContext.prevBP = this->_bp;
    newContext.prevPC = this->_ip;
    ensureStackUsed(calledFunction.paramSize);
    this->_bp = this->_sp - calledFunction.paramSize;
    newContext.prevSP = this->_bp;
    newContext.BP = this->_bp;
    _contexts.push_back(newContext);
    this->_ip = -1;
    this->_currentInstructions = calledFunction.instructions;
}